

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

bool __thiscall Minisat::Solver::binResMinimize(Solver *this,vec<Minisat::Lit> *out_learnt)

{
  uint64_t *puVar1;
  Lit *pLVar2;
  unsigned_long *puVar3;
  vec<Minisat::Watcher> *pvVar4;
  Watcher *pWVar5;
  lbool *plVar6;
  unsigned_long uVar7;
  ulong uVar8;
  int iVar9;
  uint64_t uVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  
  uVar10 = this->counter + 1;
  this->counter = uVar10;
  iVar12 = out_learnt->sz;
  uVar8 = (ulong)iVar12;
  pLVar2 = out_learnt->data;
  if (1 < (long)uVar8) {
    puVar3 = (this->seen2).data;
    uVar14 = 1;
    do {
      puVar3[pLVar2[uVar14].x >> 1] = uVar10;
      uVar14 = uVar14 + 1;
    } while (uVar8 != uVar14);
  }
  iVar9 = pLVar2->x;
  pvVar4 = (this->watches_bin).occs.data;
  puVar1 = &(this->statistics).solveSteps;
  *puVar1 = *puVar1 + 1;
  uVar14 = (long)iVar9 ^ 1;
  lVar13 = (long)pvVar4[uVar14].sz;
  if (lVar13 < 1) {
    iVar9 = 0;
  }
  else {
    pWVar5 = pvVar4[uVar14].data;
    puVar3 = (this->seen2).data;
    plVar6 = (this->assigns).data;
    lVar11 = 0;
    iVar9 = 0;
    do {
      iVar15 = pWVar5[lVar11].blocker.x;
      iVar16 = iVar15 >> 1;
      uVar7 = puVar3[iVar16];
      if ((uVar7 == this->counter) && (plVar6[iVar16].value == ((byte)iVar15 & 1))) {
        iVar9 = iVar9 + 1;
        puVar3[iVar16] = uVar7 - 1;
      }
      lVar11 = lVar11 + 1;
    } while (lVar13 != lVar11);
    if (0 < iVar9) {
      iVar15 = iVar12 - iVar9;
      if (1 < iVar15) {
        iVar12 = iVar12 + -1;
        puVar3 = (this->seen2).data;
        uVar7 = this->counter;
        iVar16 = 1;
        do {
          iVar15 = iVar16;
          if (puVar3[pLVar2[iVar16].x >> 1] != uVar7) {
            lVar13 = (long)iVar12;
            iVar12 = iVar12 + -1;
            iVar15 = iVar16 + -1;
            pLVar2[iVar16].x = pLVar2[lVar13].x;
            uVar8 = (ulong)(uint)out_learnt->sz;
          }
          iVar16 = iVar15 + 1;
          iVar15 = (int)uVar8 - iVar9;
        } while (iVar16 < iVar15);
      }
      out_learnt->sz = iVar15;
      iVar9 = 1;
    }
  }
  return iVar9 != 0;
}

Assistant:

bool Solver::binResMinimize(vec<Lit> &out_learnt)
{
    // Preparation: remember which false variables we have in 'out_learnt'.
    counter++;
    for (int i = 1; i < out_learnt.size(); i++) seen2[var(out_learnt[i])] = counter;

    // Get the list of binary clauses containing 'out_learnt[0]'.
    const vec<Watcher> &ws = watches_bin[~out_learnt[0]];
    statistics.solveSteps++;

    int to_remove = 0;
    for (int i = 0; i < ws.size(); i++) {
        Lit the_other = ws[i].blocker;
        // Does 'the_other' appear negatively in 'out_learnt'?
        if (seen2[var(the_other)] == counter && value(the_other) == l_True) {
            to_remove++;
            seen2[var(the_other)] = counter - 1; // Remember to remove this variable.
        }
    }

    // Shrink.
    if (to_remove > 0) {
        int last = out_learnt.size() - 1;
        for (int i = 1; i < out_learnt.size() - to_remove; i++)
            if (seen2[var(out_learnt[i])] != counter) out_learnt[i--] = out_learnt[last--];
        out_learnt.shrink(to_remove);
    }
    return to_remove != 0;
}